

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskBuilder.cpp
# Opt level: O2

vector<FormatType_*,_std::allocator<FormatType_*>_> * __thiscall
DiskBuilder::GetFormatsList
          (vector<FormatType_*,_std::allocator<FormatType_*>_> *__return_storage_ptr__,
          DiskBuilder *this,FormatAction action)

{
  char cVar1;
  long lVar2;
  pointer __x;
  
  (__return_storage_ptr__->super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__x = (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
      __x != (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
             _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    lVar2 = 0x18;
    if (((action == READ) || (lVar2 = 0x20, action == WRITE)) &&
       (cVar1 = (**(code **)((long)(*__x)->_vptr_FormatType + lVar2))(), cVar1 != '\0')) {
      std::vector<FormatType_*,_std::allocator<FormatType_*>_>::push_back
                (__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<FormatType*> DiskBuilder::GetFormatsList(DiskBuilder::FormatAction action)
{
   std::vector<FormatType*> format_list;

   for (auto it = format_list_.begin(); it != format_list_.end(); it++)
   {
      bool add = false;
      switch (action)
      {
      case READ:
         add = (*it)->CanLoad();
         break;
      case WRITE:
         add = (*it)->CanSave();
         break;
      }
      if (add)
      {
         format_list.push_back(*it);
      }
   }
   return format_list;
}